

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

float * stbi__hdr_load(stbi__context *s,int *x,int *y,int *comp,int req_comp)

{
  stbi_uc sVar1;
  stbi_uc sVar2;
  stbi_uc sVar3;
  byte bVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  float *output;
  long lVar8;
  int req_comp_00;
  ulong uVar9;
  ulong uVar10;
  char *pcVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  void *pvVar17;
  float *output_00;
  bool bVar18;
  char local_4a8 [3];
  char local_4a5 [5];
  char buffer [1024];
  stbi_uc local_a0 [4];
  stbi_uc local_9c;
  stbi_uc local_9b;
  stbi_uc local_9a;
  stbi_uc local_99;
  stbi_uc rgbe_1 [4];
  stbi_uc rgbe [4];
  float *local_58;
  void *local_38;
  
  stbi__hdr_gettoken(s,local_4a8);
  iVar5 = bcmp(local_4a8,"#?RADIANCE",0xb);
  if (iVar5 == 0) {
    bVar18 = false;
    while (stbi__hdr_gettoken(s,local_4a8), local_4a8[0] != '\0') {
      iVar5 = bcmp(local_4a8,"FORMAT=32-bit_rle_rgbe",0x17);
      if (iVar5 == 0) {
        bVar18 = true;
      }
    }
    if (bVar18) {
      stbi__hdr_gettoken(s,local_4a8);
      iVar5 = bcmp(local_4a8,"-Y ",3);
      if (iVar5 == 0) {
        _rgbe_1 = local_4a5;
        uVar6 = strtol(_rgbe_1,(char **)rgbe_1,10);
        _rgbe_1 = _rgbe_1 + 2;
        do {
          pcVar11 = _rgbe_1;
          _rgbe_1 = pcVar11 + 1;
        } while (pcVar11[-2] == ' ');
        if (((pcVar11[-2] == '+') && (pcVar11[-1] == 'X')) && (*pcVar11 == ' ')) {
          iVar14 = 0;
          uVar7 = strtol(_rgbe_1,(char **)0x0,10);
          uVar12 = (uint)uVar7;
          *x = uVar12;
          iVar5 = (int)uVar6;
          *y = iVar5;
          if (comp != (int *)0x0) {
            *comp = 3;
          }
          req_comp_00 = 3;
          if (req_comp != 0) {
            req_comp_00 = req_comp;
          }
          output = (float *)malloc((long)(int)(iVar5 * uVar12 * req_comp_00) << 2);
          if (uVar12 - 0x8000 < 0xffff8008) goto LAB_0011a80a;
          uVar9 = 0;
          uVar10 = 0;
          if (0 < iVar5) {
            uVar10 = uVar6 & 0xffffffff;
          }
          local_38 = (void *)0x0;
          local_58 = output;
          while( true ) {
            iVar15 = 1;
            if (uVar9 == uVar10) {
              free(local_38);
              return output;
            }
            sVar1 = stbi__get8(s);
            sVar2 = stbi__get8(s);
            sVar3 = stbi__get8(s);
            if (((sVar1 != '\x02') || (sVar2 != '\x02')) || ((char)sVar3 < '\0')) break;
            sVar1 = stbi__get8(s);
            if (CONCAT11(sVar3,sVar1) != uVar12) {
              free(output);
              free(local_38);
              stbi__g_failure_reason = "invalid decoded scanline length";
              return (float *)0x0;
            }
            if (local_38 == (void *)0x0) {
              local_38 = malloc((ulong)(uVar12 * 4));
            }
            pvVar17 = local_38;
            for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
              lVar16 = 0;
              while (iVar14 = (int)lVar16, iVar14 < (int)uVar12) {
                bVar4 = stbi__get8(s);
                uVar13 = (uint)bVar4;
                if (bVar4 < 0x81) {
                  lVar16 = (long)iVar14;
                  while (bVar18 = uVar13 != 0, uVar13 = uVar13 - 1, bVar18) {
                    sVar1 = stbi__get8(s);
                    *(stbi_uc *)((long)pvVar17 + lVar16 * 4) = sVar1;
                    lVar16 = lVar16 + 1;
                  }
                }
                else {
                  sVar1 = stbi__get8(s);
                  uVar13 = bVar4 & 0x7f;
                  lVar16 = (long)iVar14;
                  while (bVar18 = uVar13 != 0, uVar13 = uVar13 - 1, bVar18) {
                    *(stbi_uc *)((long)pvVar17 + lVar16 * 4) = sVar1;
                    lVar16 = lVar16 + 1;
                  }
                }
              }
              pvVar17 = (void *)((long)pvVar17 + 1);
            }
            output_00 = local_58;
            for (lVar8 = 0; (uVar7 & 0xffffffff) << 2 != lVar8; lVar8 = lVar8 + 4) {
              stbi__hdr_convert(output_00,(stbi_uc *)((long)local_38 + lVar8),req_comp_00);
              output_00 = output_00 + req_comp_00;
            }
            uVar9 = uVar9 + 1;
            local_58 = local_58 + (long)req_comp_00 * (uVar7 & 0xffffffff);
          }
          local_9c = sVar1;
          local_9b = sVar2;
          local_9a = sVar3;
          local_99 = stbi__get8(s);
          stbi__hdr_convert(output,&local_9c,req_comp_00);
          free(local_38);
          iVar14 = 0;
          do {
            stbi__getn(s,local_a0,4);
            stbi__hdr_convert(output + (long)(int)(req_comp_00 * uVar12 * iVar14) +
                                       (long)(iVar15 * req_comp_00),local_a0,req_comp_00);
            iVar15 = iVar15 + 1;
            while ((int)uVar12 <= iVar15) {
              iVar14 = iVar14 + 1;
LAB_0011a80a:
              iVar15 = 0;
              if (iVar5 <= iVar14) {
                return output;
              }
            }
          } while( true );
        }
      }
      stbi__g_failure_reason = "unsupported data layout";
    }
    else {
      stbi__g_failure_reason = "unsupported format";
    }
  }
  else {
    stbi__g_failure_reason = "not HDR";
  }
  return (float *)0x0;
}

Assistant:

static float *stbi__hdr_load(stbi__context *s, int *x, int *y, int *comp, int req_comp)
{
   char buffer[STBI__HDR_BUFLEN];
   char *token;
   int valid = 0;
   int width, height;
   stbi_uc *scanline;
   float *hdr_data;
   int len;
   unsigned char count, value;
   int i, j, k, c1,c2, z;


   // Check identifier
   if (strcmp(stbi__hdr_gettoken(s,buffer), "#?RADIANCE") != 0)
      return stbi__errpf("not HDR", "Corrupt HDR image");

   // Parse header
   for(;;) {
      token = stbi__hdr_gettoken(s,buffer);
      if (token[0] == 0) break;
      if (strcmp(token, "FORMAT=32-bit_rle_rgbe") == 0) valid = 1;
   }

   if (!valid)    return stbi__errpf("unsupported format", "Unsupported HDR format");

   // Parse width and height
   // can't use sscanf() if we're not using stdio!
   token = stbi__hdr_gettoken(s,buffer);
   if (strncmp(token, "-Y ", 3))  return stbi__errpf("unsupported data layout", "Unsupported HDR format");
   token += 3;
   height = (int) strtol(token, &token, 10);
   while (*token == ' ') ++token;
   if (strncmp(token, "+X ", 3))  return stbi__errpf("unsupported data layout", "Unsupported HDR format");
   token += 3;
   width = (int) strtol(token, NULL, 10);

   *x = width;
   *y = height;

   if (comp) *comp = 3;
   if (req_comp == 0) req_comp = 3;

   // Read data
   hdr_data = (float *) stbi__malloc(height * width * req_comp * sizeof(float));

   // Load image data
   // image data is stored as some number of sca
   if ( width < 8 || width >= 32768) {
      // Read flat data
      for (j=0; j < height; ++j) {
         for (i=0; i < width; ++i) {
            stbi_uc rgbe[4];
           main_decode_loop:
            stbi__getn(s, rgbe, 4);
            stbi__hdr_convert(hdr_data + j * width * req_comp + i * req_comp, rgbe, req_comp);
         }
      }
   } else {
      // Read RLE-encoded data
      scanline = NULL;

      for (j = 0; j < height; ++j) {
         c1 = stbi__get8(s);
         c2 = stbi__get8(s);
         len = stbi__get8(s);
         if (c1 != 2 || c2 != 2 || (len & 0x80)) {
            // not run-length encoded, so we have to actually use THIS data as a decoded
            // pixel (note this can't be a valid pixel--one of RGB must be >= 128)
            stbi_uc rgbe[4];
            rgbe[0] = (stbi_uc) c1;
            rgbe[1] = (stbi_uc) c2;
            rgbe[2] = (stbi_uc) len;
            rgbe[3] = (stbi_uc) stbi__get8(s);
            stbi__hdr_convert(hdr_data, rgbe, req_comp);
            i = 1;
            j = 0;
            STBI_FREE(scanline);
            goto main_decode_loop; // yes, this makes no sense
         }
         len <<= 8;
         len |= stbi__get8(s);
         if (len != width) { STBI_FREE(hdr_data); STBI_FREE(scanline); return stbi__errpf("invalid decoded scanline length", "corrupt HDR"); }
         if (scanline == NULL) scanline = (stbi_uc *) stbi__malloc(width * 4);

         for (k = 0; k < 4; ++k) {
            i = 0;
            while (i < width) {
               count = stbi__get8(s);
               if (count > 128) {
                  // Run
                  value = stbi__get8(s);
                  count -= 128;
                  for (z = 0; z < count; ++z)
                     scanline[i++ * 4 + k] = value;
               } else {
                  // Dump
                  for (z = 0; z < count; ++z)
                     scanline[i++ * 4 + k] = stbi__get8(s);
               }
            }
         }
         for (i=0; i < width; ++i)
            stbi__hdr_convert(hdr_data+(j*width + i)*req_comp, scanline + i*4, req_comp);
      }
      STBI_FREE(scanline);
   }

   return hdr_data;
}